

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O2

void __thiscall
firmata::FirmataMarshaller::sendFirmwareVersion
          (FirmataMarshaller *this,uint8_t major,uint8_t minor,size_t bytec,uint8_t *bytev)

{
  size_t __n;
  undefined7 in_register_00000011;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *__buf_02;
  void *extraout_RDX_00;
  bool bVar1;
  
  if (this->FirmataStream != (Stream *)0x0) {
    __n = bytec;
    serial_wiring::Stream::write
              (this->FirmataStream,0xf0,(void *)CONCAT71(in_register_00000011,minor),bytec);
    serial_wiring::Stream::write(this->FirmataStream,0x79,__buf,__n);
    serial_wiring::Stream::write(this->FirmataStream,(uint)major,__buf_00,__n);
    serial_wiring::Stream::write(this->FirmataStream,(uint)minor,__buf_01,__n);
    __buf_02 = extraout_RDX;
    while (bVar1 = bytec != 0, bytec = bytec - 1, bVar1) {
      __n = 0;
      encodeByteStream(this,1,bytev,0);
      bytev = bytev + 1;
      __buf_02 = extraout_RDX_00;
    }
    serial_wiring::Stream::write(this->FirmataStream,0xf7,__buf_02,__n);
    return;
  }
  return;
}

Assistant:

void FirmataMarshaller::sendFirmwareVersion(uint8_t major, uint8_t minor, size_t bytec, uint8_t *bytev)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  size_t i;
  FirmataStream->write(START_SYSEX);
  FirmataStream->write(REPORT_FIRMWARE);
  FirmataStream->write(major);
  FirmataStream->write(minor);
  for (i = 0; i < bytec; ++i) {
    encodeByteStream(sizeof(bytev[i]), reinterpret_cast<uint8_t *>(&bytev[i]));
  }
  FirmataStream->write(END_SYSEX);
}